

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_copy_list_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp in_RCX;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp tmp;
  sexp in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar1;
  undefined1 *n_00;
  sexp self_00;
  sexp psVar2;
  sexp local_30;
  sexp local_28;
  sexp local_8;
  
  psVar2 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb8,0,0x10);
  local_8 = in_RCX;
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 6)) {
    n_00 = &stack0xffffffffffffffc8;
    self_00 = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffb8;
    local_8 = sexp_cons_op(psVar2,self_00,(sexp_sint_t)n_00,
                           (sexp)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8);
    local_28 = (in_RCX->value).type.cpl;
    local_30 = local_8;
    while( true ) {
      bVar1 = false;
      if (((ulong)local_28 & 3) == 0) {
        bVar1 = local_28->tag == 6;
      }
      if (bVar1 == false) break;
      psVar2 = sexp_cons_op(local_8,self_00,(sexp_sint_t)n_00,
                            (sexp)CONCAT17(bVar1,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8);
      (local_30->value).type.cpl = psVar2;
      local_28 = (local_28->value).type.cpl;
      local_30 = (local_30->value).type.cpl;
    }
    *(sexp *)(in_RDI + 0x6080) = self_00;
  }
  return local_8;
}

Assistant:

sexp sexp_copy_list_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp tmp;
  sexp_gc_var1(res);
  if (! sexp_pairp(ls)) return ls;
  sexp_gc_preserve1(ctx, res);
  tmp = res = sexp_cons(ctx, sexp_car(ls), sexp_cdr(ls));
  for (ls=sexp_cdr(ls); sexp_pairp(ls); ls=sexp_cdr(ls), tmp=sexp_cdr(tmp))
    sexp_cdr(tmp) = sexp_cons(ctx, sexp_car(ls), sexp_cdr(ls));
  sexp_gc_release1(ctx);
  return res;
}